

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoadConstantLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedField<unsigned_long> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int rank;
  void *outChannels;
  string *psVar3;
  bool bVar4;
  LogMessage *pLVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  LayerUnion LVar8;
  WeightParams *pWVar9;
  long *plVar10;
  unsigned_long *puVar11;
  size_type *psVar12;
  uint uVar13;
  size_type sVar14;
  _Alloc_hider _Var15;
  undefined1 auVar16 [8];
  uint64_t expectedUnits;
  Result r;
  string err;
  string err_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  undefined1 local_130 [24];
  string local_118;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  undefined1 local_e8 [40];
  string local_c0;
  LogMessage local_a0;
  LogMessage local_68;
  
  Result::Result((Result *)&local_168);
  validateInputCount((Result *)local_f8,layer,0,0);
  local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8;
  std::__cxx11::string::operator=((string *)&local_160,(string *)&local_f0);
  pcVar2 = local_e8 + 8;
  if (local_f0._M_p != pcVar2) {
    operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_168);
  if (bVar4) {
    validateOutputCount((Result *)local_f8,layer,1,1);
    local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8;
    std::__cxx11::string::operator=((string *)&local_160,(string *)&local_f0);
    if (local_f0._M_p != pcVar2) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
  }
  bVar4 = Result::good((Result *)&local_168);
  if (bVar4) {
    if (this->ndArrayInterpretation == true) {
      if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar5);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
      }
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(this->blobNameToRank)._M_t,
                     (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      if ((_Rb_tree_header *)iVar6._M_node !=
          &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header) {
        if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar5 = google::protobuf::internal::LogMessage::operator<<
                             (&local_68,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar5);
          google::protobuf::internal::LogMessage::~LogMessage(&local_68);
        }
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(&this->blobNameToRank,
                      (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        rank = *pmVar7;
        local_140 = (undefined1  [8])local_130;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"LoadConstant","");
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"output","");
        checkRank((Result *)local_f8,layer,(string *)local_140,5,5,&local_118,rank);
        local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8;
        std::__cxx11::string::operator=((string *)&local_160,(string *)&local_f0);
        if (local_f0._M_p != pcVar2) {
          operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (local_140 != (undefined1  [8])local_130) {
          operator_delete((void *)local_140,local_130._0_8_ + 1);
        }
        bVar4 = Result::good((Result *)&local_168);
        if (!bVar4) goto LAB_002d009d;
      }
    }
    if (layer->_oneof_case_[0] == 0x122) {
      LVar8 = layer->layer_;
    }
    else {
      LVar8.loadconstant_ = Specification::LoadConstantLayerParams::default_instance();
    }
    pWVar9 = (LVar8.batchnorm_)->variance_;
    if (pWVar9 == (WeightParams *)0x0) {
      pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    bVar4 = 0 < (pWVar9->floatvalue_).current_size_;
    uVar13 = bVar4 + 1;
    if (((pWVar9->float16value_).ptr_)->_M_string_length == 0) {
      uVar13 = (uint)bVar4;
    }
    if (((uVar13 - (((pWVar9->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
        (uint)(((pWVar9->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
      if (((LVar8.convolution_)->kernelsize_).current_size_ == 3) {
        this_00 = &(LVar8.convolution_)->kernelsize_;
        uVar13 = 0;
        if (this_00->current_size_ < 1) {
          expectedUnits = 1;
        }
        else {
          expectedUnits = 1;
          do {
            puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,uVar13);
            expectedUnits = expectedUnits * *puVar11;
            uVar13 = uVar13 + 1;
          } while ((int)uVar13 < this_00->current_size_);
          uVar13 = (uint)(this_00->current_size_ == 3);
        }
        if (((char)uVar13 == '\0') ||
           (((LVar8.innerproduct_)->bias_->_internal_metadata_).
            super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
            .ptr_ < (void *)0x2)) {
          pWVar9 = (LVar8.batchnorm_)->variance_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          local_140 = (undefined1  [8])local_130;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"LoadConstant","");
          psVar3 = (layer->name_).ptr_;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"constants","");
          validateGeneralWeightParams
                    ((Result *)local_f8,pWVar9,expectedUnits,1,(string *)local_140,psVar3,&local_118
                    );
          local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8;
          std::__cxx11::string::operator=((string *)&local_160,(string *)&local_f0);
          if (local_f0._M_p != local_e8 + 8) {
            operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          local_118.field_2._M_allocated_capacity = local_130._0_8_;
          _Var15._M_p = (pointer)local_140;
          if (local_140 != (undefined1  [8])local_130) goto LAB_002d007a;
        }
        else {
          pWVar9 = (LVar8.batchnorm_)->variance_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          if (((LVar8.convolution_)->kernelsize_).current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_f8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar5 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_f8,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar5);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_f8);
          }
          outChannels = ((LVar8.innerproduct_)->bias_->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                        .ptr_;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"LoadConstant","");
          psVar3 = (layer->name_).ptr_;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"constants","");
          validateGeneralWeightParams
                    ((Result *)local_140,pWVar9,expectedUnits,(uint64_t)outChannels,&local_118,
                     psVar3,&local_c0);
          local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140;
          std::__cxx11::string::operator=((string *)&local_160,(string *)&local_138);
          if (local_138._M_p != local_130 + 8) {
            operator_delete(local_138._M_p,local_130._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          _Var15._M_p = local_118._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_002d007a:
            operator_delete(_Var15._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
        }
        bVar4 = Result::good((Result *)&local_168);
        if (bVar4) {
          Result::Result(__return_storage_ptr__);
          goto LAB_002d015c;
        }
        goto LAB_002d009d;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "Load constant layer \'",(layer->name_).ptr_);
      plVar10 = (long *)std::__cxx11::string::append(local_140);
      psVar12 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_e8._0_8_ = *psVar12;
        local_e8._8_8_ = plVar10[3];
        local_f8 = (undefined1  [8])local_e8;
      }
      else {
        local_e8._0_8_ = *psVar12;
        local_f8 = (undefined1  [8])*plVar10;
      }
      local_f0._M_p = (pointer)plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if (local_140 != (undefined1  [8])local_130) {
        operator_delete((void *)local_140,local_130._0_8_ + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f8);
      sVar14 = local_e8._0_8_;
      auVar16 = local_f8;
      if (local_f8 == (undefined1  [8])local_e8) goto LAB_002d015c;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     "Load constant layer \'",(layer->name_).ptr_);
      plVar10 = (long *)std::__cxx11::string::append(local_f8);
      psVar12 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_130._0_8_ = *psVar12;
        local_130._8_8_ = plVar10[3];
        local_140 = (undefined1  [8])local_130;
      }
      else {
        local_130._0_8_ = *psVar12;
        local_140 = (undefined1  [8])*plVar10;
      }
      local_138._M_p = (pointer)plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if (local_f8 != (undefined1  [8])local_e8) {
        operator_delete((void *)local_f8,local_e8._0_8_ + 1);
      }
      Result::Result((Result *)local_f8,INVALID_MODEL_PARAMETERS,(string *)local_140);
      local_168 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8;
      std::__cxx11::string::operator=((string *)&local_160,(string *)&local_f0);
      if (local_f0._M_p != pcVar2) {
        operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
      }
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)__return_storage_ptr__ = local_168;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_p == &local_150) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_150._M_allocated_capacity._1_7_,local_150._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_150._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_160._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             CONCAT71(local_150._M_allocated_capacity._1_7_,local_150._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_158;
      local_158 = 0;
      local_150._M_local_buf[0] = '\0';
      sVar14 = local_130._0_8_;
      auVar16 = local_140;
      local_160._M_p = (pointer)&local_150;
      if (local_140 == (undefined1  [8])local_130) goto LAB_002d015c;
    }
    operator_delete((void *)auVar16,sVar14 + 1);
  }
  else {
LAB_002d009d:
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)__return_storage_ptr__ = local_168;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_p == &local_150) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_150._M_allocated_capacity._1_7_,local_150._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_150._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_160._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_150._M_allocated_capacity._1_7_,local_150._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_158;
    local_158 = 0;
    local_150._M_local_buf[0] = '\0';
    local_160._M_p = (pointer)&local_150;
  }
LAB_002d015c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_p != &local_150) {
    operator_delete(local_160._M_p,
                    CONCAT71(local_150._M_allocated_capacity._1_7_,local_150._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoadConstantLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            int rank = blobNameToRank.at(layer.output(0));
            r = checkRank(layer, "LoadConstant", 5, 5, "output", rank);
            if (!r.good()) {return r;}
        }
    }

    const auto& params = layer.loadconstant();
    WeightParamType paramType = valueType(params.data());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Load constant layer '" + layer.name() + "' has both full precision and half precision weight fields populated";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (params.shape_size() != 3) {
        std::string err = "Load constant layer '" + layer.name() + "' must be a 3D constant.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        r = validateGeneralWeightParams(params.data(), total_shape, params.shape(0), "LoadConstant", layer.name(), "constants");
    } else {
        r = validateGeneralWeightParams(params.data(), total_shape, 1, "LoadConstant", layer.name(), "constants");
    }

    if (!r.good()) return r;

    return Result();
}